

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNearestNeighborsClassifierValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)404>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  ostream *poVar2;
  Type *pTVar3;
  int iVar4;
  undefined1 *int64Parameter;
  int i;
  int iVar5;
  int iVar6;
  undefined1 *puVar7;
  ValidationPolicy *in_stack_fffffffffffffe08;
  string local_1f0;
  Result res;
  stringstream out;
  string local_1a0 [8];
  ostream local_198 [376];
  
  if (format->_oneof_case_[0] == 0x194) {
    puVar7 = (undefined1 *)(format->Type_).neuralnetworkregressor_;
  }
  else {
    puVar7 = Specification::_KNearestNeighborsClassifier_default_instance_;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&out,"numberOfNeighbors",(allocator<char> *)&local_1f0);
  int64Parameter =
       *(undefined1 **)
        &(((NeuralNetworkRegressor *)puVar7)->layers_).super_RepeatedPtrFieldBase.current_size_;
  if ((Int64Parameter *)int64Parameter == (Int64Parameter *)0x0) {
    int64Parameter = Specification::_Int64Parameter_default_instance_;
  }
  validateInt64Parameter(&res,(string *)&out,(Int64Parameter *)int64Parameter,true);
  std::__cxx11::string::~string((string *)&out);
  bVar1 = Result::good(&res);
  if (bVar1) {
    if (*(int *)((long)&((NeuralNetworkRegressor *)puVar7)->updateparams_ + 4) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar2 = std::operator<<(local_198,
                               "KNearestNeighborsClassifier requires a weighting scheme to be set.")
      ;
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
    }
    else {
      iVar6 = *(int *)((long)&(((NeuralNetworkRegressor *)puVar7)->preprocessing_).
                              super_RepeatedPtrFieldBase.rep_ + 4);
      iVar5 = 0;
      if (iVar6 == 100) {
        iVar5 = *(int *)(((((NeuralNetworkRegressor *)puVar7)->layers_).super_RepeatedPtrFieldBase.
                         rep_)->elements + 2);
LAB_0026d46f:
        iVar4 = 0;
      }
      else {
        if (iVar6 != 0x65) goto LAB_0026d46f;
        iVar4 = *(int *)(((((NeuralNetworkRegressor *)puVar7)->layers_).super_RepeatedPtrFieldBase.
                         rep_)->elements + 1);
      }
      if (iVar5 < iVar4) {
        iVar5 = iVar4;
      }
      iVar4 = *(int *)&((NeuralNetworkRegressor *)puVar7)->updateparams_;
      if (iVar4 == 0) {
        if (iVar5 == 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)&out);
          poVar2 = std::operator<<(local_198,
                                   "KNearestNeighborsClassifier should specify default class labels when class labels are not specified."
                                  );
          std::endl<char,std::char_traits<char>>(poVar2);
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
        }
        else {
LAB_0026d544:
          bVar1 = false;
LAB_0026d546:
          if (format->_oneof_case_[0] == 0x194) {
            puVar7 = (undefined1 *)(format->Type_).pipelineclassifier_;
          }
          else {
            puVar7 = Specification::_KNearestNeighborsClassifier_default_instance_;
          }
          local_1f0._M_dataplus._M_p._0_4_ = 0;
          validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
                    ((Result *)&out,(CoreML *)format,(Model *)puVar7,
                     (KNearestNeighborsClassifier *)0x1,bVar1,SUB81(&local_1f0,0),
                     in_stack_fffffffffffffe08);
          Result::operator=(&res,(Result *)&out);
          std::__cxx11::string::~string(local_1a0);
          bVar1 = Result::good(&res);
          if (!bVar1) goto LAB_0026d5b2;
          if (format->_oneof_case_[0] == 0x194) {
            puVar7 = (undefined1 *)(format->Type_).knearestneighborsclassifier_;
          }
          else {
            puVar7 = Specification::_KNearestNeighborsClassifier_default_instance_;
          }
          puVar7 = (undefined1 *)((KNearestNeighborsClassifier *)puVar7)->nearestneighborsindex_;
          if ((NearestNeighborsIndex *)puVar7 == (NearestNeighborsIndex *)0x0) {
            puVar7 = Specification::_NearestNeighborsIndex_default_instance_;
          }
          iVar6 = (((NearestNeighborsIndex *)puVar7)->floatsamples_).super_RepeatedPtrFieldBase.
                  current_size_;
          if ((iVar5 == 0) || (iVar6 != 0)) {
            if (iVar6 == iVar5) {
              iVar6 = 0;
              do {
                if ((((NearestNeighborsIndex *)puVar7)->floatsamples_).super_RepeatedPtrFieldBase.
                    current_size_ <= iVar6) {
                  if (((NearestNeighborsIndex *)puVar7)->_oneof_case_[0] != 100) {
                    if (((NearestNeighborsIndex *)puVar7)->_oneof_case_[0] != 0x6e) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&out);
                      poVar2 = std::operator<<(local_198,
                                               "KNearestNeighborsClassifier has no index type specified."
                                              );
                      std::endl<char,std::char_traits<char>>(poVar2);
                      std::__cxx11::stringbuf::str();
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
                      goto LAB_0026d792;
                    }
                    if (((((NearestNeighborsIndex *)puVar7)->IndexType_).singlekdtreeindex_)->
                        leafsize_ < 1) {
                      std::__cxx11::stringstream::stringstream((stringstream *)&out);
                      poVar2 = std::operator<<(local_198,
                                               "KNearestNeighborsClassifier requires leaf size to be a positive integer."
                                              );
                      std::endl<char,std::char_traits<char>>(poVar2);
                      std::__cxx11::stringbuf::str();
                      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
                      goto LAB_0026d792;
                    }
                  }
                  if (((NearestNeighborsIndex *)puVar7)->_oneof_case_[1] != 0) {
                    Result::Result(__return_storage_ptr__);
                    goto LAB_0026d7a6;
                  }
                  std::__cxx11::stringstream::stringstream((stringstream *)&out);
                  poVar2 = std::operator<<(local_198,
                                           "KNearestNeighborsClassifier requires a distance function to be set."
                                          );
                  std::endl<char,std::char_traits<char>>(poVar2);
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
                  goto LAB_0026d792;
                }
                pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                                   (&(((NearestNeighborsIndex *)puVar7)->floatsamples_).
                                     super_RepeatedPtrFieldBase,iVar6);
                iVar6 = iVar6 + 1;
              } while ((pTVar3->vector_).current_size_ ==
                       ((NearestNeighborsIndex *)puVar7)->numberofdimensions_);
              std::__cxx11::stringstream::stringstream((stringstream *)&out);
              poVar2 = std::operator<<(local_198,"Unexpected length \"");
              poVar2 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar2,
                                  (((NearestNeighborsIndex *)puVar7)->floatsamples_).
                                  super_RepeatedPtrFieldBase.current_size_);
              poVar2 = std::operator<<(poVar2,"\" given the provided number of dimensions \"");
              poVar2 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar2,
                                  ((NearestNeighborsIndex *)puVar7)->numberofdimensions_);
              poVar2 = std::operator<<(poVar2,".");
              std::endl<char,std::char_traits<char>>(poVar2);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&out);
              poVar2 = std::operator<<(local_198,"Unexpected number of labels \"");
              poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar5);
              poVar2 = std::operator<<(poVar2,"\" for the given number of examples: \"");
              poVar2 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)poVar2,
                                  (((NearestNeighborsIndex *)puVar7)->floatsamples_).
                                  super_RepeatedPtrFieldBase.current_size_);
              poVar2 = std::operator<<(poVar2,".");
              std::endl<char,std::char_traits<char>>(poVar2);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
            }
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)&out);
            poVar2 = std::operator<<(local_198,"KNearestNeighborsClassifier has no data points.");
            std::endl<char,std::char_traits<char>>(poVar2);
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
          }
        }
      }
      else if (iVar4 == 0x6e) {
        bVar1 = false;
        if ((iVar6 == 0) || (iVar6 == 100)) goto LAB_0026d546;
        std::__cxx11::stringstream::stringstream((stringstream *)&out);
        poVar2 = std::operator<<(local_198,
                                 "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                );
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
      }
      else {
        if (iVar4 != 0x6f) goto LAB_0026d544;
        bVar1 = true;
        if ((iVar6 == 0) || (iVar6 == 0x65)) goto LAB_0026d546;
        std::__cxx11::stringstream::stringstream((stringstream *)&out);
        poVar2 = std::operator<<(local_198,
                                 "KNearestNeighborsClassifier\'s class label and default class label have different types."
                                );
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f0);
      }
    }
LAB_0026d792:
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::stringstream::~stringstream((stringstream *)&out);
  }
  else {
LAB_0026d5b2:
    Result::Result(__return_storage_ptr__,&res);
  }
LAB_0026d7a6:
  std::__cxx11::string::~string((string *)&res.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_kNearestNeighborsClassifier>(const Specification::Model& format) {

        const Specification::KNearestNeighborsClassifier& knnClassifier = format.knearestneighborsclassifier();

        Result res = validateInt64Parameter("numberOfNeighbors", knnClassifier.numberofneighbors(), true);
        if (!res.good()) {
            return res;
        }

        switch (knnClassifier.WeightingScheme_case()) {
            case Specification::KNearestNeighborsClassifier::kUniformWeighting:
            case Specification::KNearestNeighborsClassifier::kInverseDistanceWeighting:
                // Valid weighting scheme
                break;

            case Specification::KNearestNeighborsClassifier::WEIGHTINGSCHEME_NOT_SET:
                std::stringstream out;
                out << "KNearestNeighborsClassifier requires a weighting scheme to be set." << std::endl;
                return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
        }

        int intLabelCount = knnClassifier.has_int64classlabels() ? knnClassifier.int64classlabels().vector_size() : 0;
        int stringLabelCount = knnClassifier.has_stringclasslabels() ? knnClassifier.stringclasslabels().vector_size() : 0;

        int labelCount = std::max(intLabelCount, stringLabelCount);

        auto classLabelCase = knnClassifier.ClassLabels_case();
        auto defaultClassLabelIsInt64 = false;

        switch (knnClassifier.DefaultClassLabel_case()) {
            case Specification::KNearestNeighborsClassifier::kDefaultStringLabel:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kStringClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = false;
                break;

            case Specification::KNearestNeighborsClassifier::kDefaultInt64Label:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kInt64ClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = true;
                break;

            case Specification::KNearestNeighborsClassifier::DEFAULTCLASSLABEL_NOT_SET:
                if (labelCount == 0) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier should specify default class labels when class labels are not specified." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
        }

        res = validateClassifierInterface(format, format.knearestneighborsclassifier(), true, defaultClassLabelIsInt64);
        if (!res.good()) {
            return res;
        }


        return validateNearestNeighborsIndex(format, labelCount);

    }